

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

UEnumeration * ucnv_openStandardNames_63(char *convName,char *standard,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  UEnumeration *buffer;
  uint32_t *puVar3;
  
  UVar1 = haveAliasData(pErrorCode);
  if (UVar1 != '\0') {
    if (convName == (char *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if ((*convName != '\0') &&
            (uVar2 = findTaggedAliasListsOffset(convName,standard,pErrorCode),
            uVar2 < gMainTable.taggedAliasListsSize)) {
      buffer = (UEnumeration *)uprv_malloc_63(0x38);
      if (buffer == (UEnumeration *)0x0) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        buffer->reset = ucnv_io_resetStandardAliases;
        buffer->uNext = uenum_unextDefault_63;
        buffer->next = ucnv_io_nextStandardAliases;
        buffer->close = ucnv_io_closeUEnumeration;
        buffer->count = ucnv_io_countStandardAliases;
        buffer->baseContext = (void *)0x0;
        buffer->context = (void *)0x0;
        puVar3 = (uint32_t *)uprv_malloc_63(8);
        if (puVar3 != (uint32_t *)0x0) {
          *puVar3 = uVar2;
          puVar3[1] = 0;
          buffer->context = puVar3;
          return buffer;
        }
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
        uprv_free_63(buffer);
      }
    }
  }
  return (UEnumeration *)0x0;
}

Assistant:

U_CAPI UEnumeration * U_EXPORT2
ucnv_openStandardNames(const char *convName,
                       const char *standard,
                       UErrorCode *pErrorCode)
{
    UEnumeration *myEnum = NULL;
    if (haveAliasData(pErrorCode) && isAlias(convName, pErrorCode)) {
        uint32_t listOffset = findTaggedAliasListsOffset(convName, standard, pErrorCode);

        /* When listOffset == 0, we want to acknowledge that the
           converter name and standard are okay, but there
           is nothing to enumerate. */
        if (listOffset < gMainTable.taggedAliasListsSize) {
            UAliasContext *myContext;

            myEnum = static_cast<UEnumeration *>(uprv_malloc(sizeof(UEnumeration)));
            if (myEnum == NULL) {
                *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
                return NULL;
            }
            uprv_memcpy(myEnum, &gEnumAliases, sizeof(UEnumeration));
            myContext = static_cast<UAliasContext *>(uprv_malloc(sizeof(UAliasContext)));
            if (myContext == NULL) {
                *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
                uprv_free(myEnum);
                return NULL;
            }
            myContext->listOffset = listOffset;
            myContext->listIdx = 0;
            myEnum->context = myContext;
        }
        /* else converter or tag not found */
    }
    return myEnum;
}